

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_uint_internal<unsigned_int>(string *text,uint *value_p)

{
  bool bVar1;
  string local_48;
  bool local_21;
  uint *puStack_20;
  bool negative;
  uint *value_p_local;
  string *text_local;
  
  *value_p = 0;
  puStack_20 = value_p;
  value_p_local = (uint *)text;
  bVar1 = safe_parse_sign(text,&local_21);
  if ((bVar1) && ((local_21 & 1U) == 0)) {
    std::__cxx11::string::string((string *)&local_48,(string *)text);
    text_local._7_1_ = safe_parse_positive_int<unsigned_int>(&local_48,puStack_20);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    text_local._7_1_ = 0;
  }
  return (bool)(text_local._7_1_ & 1);
}

Assistant:

bool safe_uint_internal(string text, IntType* value_p) {
  *value_p = 0;
  bool negative;
  if (!safe_parse_sign(&text, &negative) || negative) {
    return false;
  }
  return safe_parse_positive_int(text, value_p);
}